

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O2

void ht_put(HashTable *ht,HTItemKey key,CrispyValue value)

{
  uint32_t uVar1;
  HTKeyType HVar2;
  table_item_t *ptVar3;
  _Bool _Var4;
  uint32_t uVar5;
  HTItem *pHVar6;
  HTItem *pHVar7;
  uint64_t uVar8;
  HTItemKey *pHVar9;
  table_item_t **pptVar10;
  uint32_t i;
  ulong uVar11;
  CrispyValue value_00;
  HashTable new_ht;
  
  uVar5 = hash(key,ht->key_type);
  uVar1 = ht->cap;
  pHVar6 = (HTItem *)malloc(0x28);
  pHVar6->next = (table_item_t *)0x0;
  (pHVar6->key).field_0.key_ident_string = key.key_c_string;
  (pHVar6->key).field_0.ident_length = key.field_0.ident_length;
  (pHVar6->value).type = value.type;
  (pHVar6->value).field_1.p_value = (uint64_t)value.field_1;
  pptVar10 = ht->buckets + (uVar1 - 1 & uVar5);
  pHVar7 = *pptVar10;
  if (pHVar7 != (HTItem *)0x0) {
    HVar2 = ht->key_type;
    do {
      _Var4 = equals((HTItemKey)*(anon_struct_16_2_64a7050e_for_HTItemKey_0 *)&pHVar7->key,key,HVar2
                    );
      if (_Var4) {
        ptVar3 = (*pptVar10)->next;
        free(*pptVar10);
        *pptVar10 = pHVar6;
        pHVar6->next = ptVar3;
        goto LAB_00101fb8;
      }
      pHVar7 = (*pptVar10)->next;
      pptVar10 = &(*pptVar10)->next;
    } while (pHVar7 != (HTItem *)0x0);
  }
  *pptVar10 = pHVar6;
  ht->size = ht->size + 1;
LAB_00101fb8:
  if (ht->cap < ht->size) {
    HVar2 = ht->key_type;
    uVar8 = next_pow_of_2((ulong)ht->cap + 1);
    ht_init(&new_ht,HVar2,(uint32_t)uVar8,ht->free_callback);
    for (uVar11 = 0; uVar11 < ht->cap; uVar11 = uVar11 + 1) {
      for (pHVar9 = (HTItemKey *)(ht->buckets + uVar11);
          pHVar9 = (HTItemKey *)pHVar9->key_obj_string, pHVar9 != (HTItemKey *)0x0;
          pHVar9 = pHVar9 + 2) {
        value_00._4_4_ = 0;
        value_00.type = pHVar9[1].key_int;
        value_00.field_1.p_value =
             ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)((long)pHVar9 + 0x18))->p_value;
        ht_put(&new_ht,*pHVar9,value_00);
      }
    }
    ht_free(ht);
    ht->free_callback = new_ht.free_callback;
    ht->buckets = new_ht.buckets;
    ht->key_type = new_ht.key_type;
    ht->cap = new_ht.cap;
    ht->size = new_ht.size;
    *(undefined4 *)&ht->field_0xc = new_ht._12_4_;
  }
  return;
}

Assistant:

void ht_put(HashTable *ht, HTItemKey key, CrispyValue value) {
    uint32_t index = hash(key, ht->key_type) & (ht->cap - 1);
    HTItem *new_item = malloc(sizeof(HTItem));
    new_item->next = NULL;
    new_item->key = key;
    new_item->value = value;

    bool already_inside = false;
    if (ht->buckets[index] == NULL) {
        ht->buckets[index] = new_item;
    } else {
        already_inside = insert(&ht->buckets[index], key, ht->key_type, new_item);
    }

    if (!already_inside) {
        ++ht->size;
    }

    if (ht->size > ht->cap) {
        resize(ht);
    }
}